

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplashscreen.cpp
# Opt level: O2

void __thiscall
QSplashScreen::QSplashScreen(QSplashScreen *this,QScreen *screen,QPixmap *pixmap,WindowFlags f)

{
  QSplashScreenPrivate *this_00;
  
  this_00 = (QSplashScreenPrivate *)operator_new(0x2a0);
  QSplashScreenPrivate::QSplashScreenPrivate(this_00);
  QWidget::QWidget(&this->super_QWidget,(QWidgetPrivate *)this_00,(QWidget *)0x0,
                   (WindowFlags)
                   ((uint)f.super_QFlagsStorageHelper<Qt::WindowType,_4>.
                          super_QFlagsStorage<Qt::WindowType>.i | 0x80f));
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007d48c0;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QSplashScreen_007d4a78;
  QWidgetPrivate::setScreen(*(QWidgetPrivate **)&(this->super_QWidget).field_0x8,screen);
  setPixmap(this,pixmap);
  return;
}

Assistant:

QSplashScreen::QSplashScreen(QScreen *screen, const QPixmap &pixmap, Qt::WindowFlags f)
    : QWidget(*(new QSplashScreenPrivate()), nullptr, Qt::SplashScreen | Qt::FramelessWindowHint | f)
{
    Q_D(QSplashScreen);
    d->setScreen(screen);
    setPixmap(pixmap);
}